

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000016b5d0 = 0x2d2d2d2d2d2d2d;
    uRam000000000016b5d7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016b5c0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016b5c8 = 0x2d2d2d2d2d2d2d;
    DAT_0016b5cf = 0x2d;
    _DAT_0016b5b0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016b5b8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016b5a0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016b5a8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016b598 = 0x2d2d2d2d2d2d2d2d;
    DAT_0016b5df = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }